

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.h
# Opt level: O0

void __thiscall Semaphore::acquire(Semaphore *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Semaphore *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex);
  std::condition_variable::wait<Semaphore::acquire()::_lambda()_1_>
            (&this->cv,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  this->count = this->count + -1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void acquire()
    {
        std::unique_lock<std::mutex> lock(mutex);
        cv.wait(lock, [&](){return count > 0; });
        --count;
    }